

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFindPackageCommand::ReadListFile(cmFindPackageCommand *this,string *f,PolicyScopeRule psr)

{
  bool bVar1;
  string e;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = cmMakefile::ReadDependentFile
                    ((this->super_cmFindCommon).super_cmCommand.Makefile,f,
                     (bool)(this->PolicyScope ^ 1U | psr == NoPolicyScope));
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Error reading CMake code from \"",&local_41);
    std::__cxx11::string::append((string *)&local_40);
    std::__cxx11::string::append((char *)&local_40);
    cmCommand::SetError((cmCommand *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::ReadListFile(const std::string& f,
                                        PolicyScopeRule psr)
{
  const bool noPolicyScope = !this->PolicyScope || psr == NoPolicyScope;
  if (this->Makefile->ReadDependentFile(f, noPolicyScope)) {
    return true;
  }
  std::string e = "Error reading CMake code from \"";
  e += f;
  e += "\".";
  this->SetError(e);
  return false;
}